

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

uint256 * DescriptorID(Descriptor *desc)

{
  char *len;
  uchar *hash;
  long *in_RSI;
  CSHA256 *in_RDI;
  long in_FS_OFFSET;
  uint256 *id;
  string desc_str;
  CSHA256 *in_stack_ffffffffffffff18;
  CSHA256 *this;
  uchar *in_stack_ffffffffffffff40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*in_RSI + 0x20))(&stack0xffffffffffffffd8,in_RSI,1);
  uint256::uint256((uint256 *)in_stack_ffffffffffffff18);
  CSHA256::CSHA256(in_stack_ffffffffffffff18);
  this = (CSHA256 *)&stack0xffffffffffffffd8;
  len = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff18);
  CSHA256::Write(in_RDI,in_stack_ffffffffffffff40,(size_t)len);
  hash = base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffff18);
  CSHA256::Finalize(this,hash);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint256 *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

uint256 DescriptorID(const Descriptor& desc)
{
    std::string desc_str = desc.ToString(/*compat_format=*/true);
    uint256 id;
    CSHA256().Write((unsigned char*)desc_str.data(), desc_str.size()).Finalize(id.begin());
    return id;
}